

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O2

ParseResult * __thiscall
trivialre::re_compiler::C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy>
::ParseAlt(ParseResult *__return_storage_ptr__,
          C<trivialre::matchers::MatcherBuilder,_trivialre::re_compiler::ErrorPolicy> *this,
          string_view str)

{
  basic_string_view<char,_std::char_traits<char>_> str_00;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  undefined1 local_d8 [24];
  code *pcStack_c0;
  bool local_b8;
  size_t local_b0;
  char *pcStack_a8;
  _Storage<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false>
  local_a0;
  char local_80;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  ParseRun((ParseResult *)&local_a0._M_value,this,str);
  if ((local_78._M_len == 0) || (*local_78._M_str != '|')) {
    std::
    _Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
    ::_Optional_base((_Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                      *)__return_storage_ptr__,
                     (_Optional_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_false,_false>
                      *)&local_a0._M_value);
    (__return_storage_ptr__->second)._M_len = local_78._M_len;
    (__return_storage_ptr__->second)._M_str = local_78._M_str;
  }
  else {
    if (local_80 == '\0') {
      local_d8._0_8_ = (void *)0x0;
      local_d8._8_8_ = 0;
      pcStack_c0 = std::
                   _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                   ::_M_invoke;
      local_d8._16_8_ =
           std::
           _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
           ::_M_manager;
      std::
      optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
      ::
      emplace<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                ((optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                  *)&local_a0._M_value,
                 (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                  *)local_d8);
      std::_Function_base::~_Function_base((_Function_base *)local_d8);
    }
    str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_78,1,0xffffffffffffffff);
    ParseAlt((ParseResult *)local_d8,this,str_00);
    if (local_b8 == false) {
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_e0 = std::
                 _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                 ::_M_invoke;
      local_e8 = std::
                 _Function_handler<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/benchmark/trivialre.h:110:12)>
                 ::_M_manager;
      std::
      optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
      ::
      emplace<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                ((optional<std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool,std::function<bool(std::basic_string_view<char,std::char_traits<char>>,bool)>const&)>>
                  *)local_d8,
                 (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                  *)&local_f8);
      std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    }
    if (local_80 == '\0') {
      std::__throw_bad_optional_access();
    }
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_58 = (_Manager_type)0x0;
    local_50 = local_a0._M_value._M_invoker;
    if (local_a0._M_value.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_68._M_unused._M_object = (void *)local_a0._0_8_;
      local_68._8_8_ = local_a0._8_8_;
      local_58 = local_a0._M_value.super__Function_base._M_manager;
      local_a0._M_value.super__Function_base._M_manager = (_Manager_type)0x0;
      local_a0._M_value._M_invoker = (_Invoker_type)0x0;
    }
    if (local_b8 == false) {
      std::__throw_bad_optional_access();
    }
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (_Manager_type)0x0;
    local_30 = pcStack_c0;
    if ((_Manager_type)local_d8._16_8_ != (_Manager_type)0x0) {
      local_48._M_unused._M_object = (void *)local_d8._0_8_;
      local_48._8_8_ = local_d8._8_8_;
      local_38 = (_Manager_type)local_d8._16_8_;
      local_d8._16_8_ = (_Manager_type)0x0;
      pcStack_c0 = (_Invoker_type)0x0;
    }
    matchers::MatcherBuilder::Alt((Matcher *)&local_f8,(Matcher *)&local_68,(Matcher *)&local_48);
    std::
    optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ::
    optional<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>,_true>
              (&__return_storage_ptr__->first,
               (function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>
                *)&local_f8);
    (__return_storage_ptr__->second)._M_len = local_b0;
    (__return_storage_ptr__->second)._M_str = pcStack_a8;
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    std::
    _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
    ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
                *)local_d8);
  }
  std::
  _Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
  ::_M_reset((_Optional_payload_base<std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool,_const_std::function<bool_(std::basic_string_view<char,_std::char_traits<char>_>,_bool)>_&)>_>
              *)&local_a0._M_value);
  return __return_storage_ptr__;
}

Assistant:

ParseResult ParseAlt(std::string_view str) {
    auto [maybe_left, str_l] = ParseRun(str);
    if (IsCharAt(str_l, 0, '|')) {
      if (!maybe_left) {
        maybe_left.emplace(builder.Any());
      }
      auto [maybe_right, str_r] = ParseAlt(str_l.substr(1));
      if (!maybe_right) {
        maybe_right.emplace(builder.Any());
      }
      return {builder.Alt(std::move(maybe_left.value()), std::move(maybe_right.value())), str_r};
    }
    return {std::move(maybe_left), str_l};
  }